

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unnest.cpp
# Opt level: O0

unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
 duckdb::UnnestInit(ClientContext *context,TableFunctionInitInput *input)

{
  pointer pUVar1;
  LogicalType *in_RDI;
  templated_unique_single_t bound_unnest;
  templated_unique_single_t ref;
  templated_unique_single_t result;
  UnnestBindData *bind_data;
  unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>_>
  *in_stack_ffffffffffffff58;
  LogicalType *in_stack_ffffffffffffff60;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *this;
  _Head_base<0UL,_duckdb::GlobalTableFunctionState_*,_false> args;
  
  args._M_head_impl = (GlobalTableFunctionState *)in_RDI;
  optional_ptr<const_duckdb::FunctionData,_true>::operator->
            ((optional_ptr<const_duckdb::FunctionData,_true> *)in_stack_ffffffffffffff60);
  FunctionData::Cast<duckdb::UnnestBindData>((FunctionData *)in_stack_ffffffffffffff60);
  make_uniq<duckdb::UnnestGlobalState>();
  make_uniq<duckdb::BoundReferenceExpression,duckdb::LogicalType_const&,unsigned_int>
            ((LogicalType *)args._M_head_impl,(uint *)in_RDI);
  ListType::GetChildType(in_stack_ffffffffffffff60);
  make_uniq<duckdb::BoundUnnestExpression,duckdb::LogicalType_const&>
            ((LogicalType *)args._M_head_impl);
  unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
  unique_ptr<duckdb::BoundReferenceExpression,std::default_delete<std::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>>>,void>
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>,_true>
  ::operator->((unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>,_true>
                *)in_stack_ffffffffffffff60);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator=
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_ffffffffffffff60,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             in_stack_ffffffffffffff58);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             0x1492766);
  pUVar1 = unique_ptr<duckdb::UnnestGlobalState,_std::default_delete<duckdb::UnnestGlobalState>,_true>
           ::operator->((unique_ptr<duckdb::UnnestGlobalState,_std::default_delete<duckdb::UnnestGlobalState>,_true>
                         *)in_stack_ffffffffffffff60);
  this = &pUVar1->select_list;
  unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>::
  unique_ptr<duckdb::BoundUnnestExpression,std::default_delete<std::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>>>,void>
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)this,
             (unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>_>
              *)in_stack_ffffffffffffff58);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::push_back(&this->
               super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ,(value_type *)in_stack_ffffffffffffff58);
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             0x14927b7);
  unique_ptr<duckdb::GlobalTableFunctionState,std::default_delete<duckdb::GlobalTableFunctionState>,true>
  ::
  unique_ptr<duckdb::UnnestGlobalState,std::default_delete<std::unique_ptr<duckdb::GlobalTableFunctionState,std::default_delete<duckdb::GlobalTableFunctionState>>>,void>
            ((unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>,_true>
              *)this,(unique_ptr<duckdb::UnnestGlobalState,_std::default_delete<duckdb::UnnestGlobalState>_>
                      *)in_stack_ffffffffffffff58);
  unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>,_true>
  ::~unique_ptr((unique_ptr<duckdb::BoundUnnestExpression,_std::default_delete<duckdb::BoundUnnestExpression>,_true>
                 *)0x14927d3);
  unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>,_true>
  ::~unique_ptr((unique_ptr<duckdb::BoundReferenceExpression,_std::default_delete<duckdb::BoundReferenceExpression>,_true>
                 *)0x14927dd);
  unique_ptr<duckdb::UnnestGlobalState,_std::default_delete<duckdb::UnnestGlobalState>,_true>::
  ~unique_ptr((unique_ptr<duckdb::UnnestGlobalState,_std::default_delete<duckdb::UnnestGlobalState>,_true>
               *)0x14927ea);
  return (unique_ptr<duckdb::GlobalTableFunctionState,_std::default_delete<duckdb::GlobalTableFunctionState>_>
          )(_Tuple_impl<0UL,_duckdb::GlobalTableFunctionState_*,_std::default_delete<duckdb::GlobalTableFunctionState>_>
            )args._M_head_impl;
}

Assistant:

static unique_ptr<GlobalTableFunctionState> UnnestInit(ClientContext &context, TableFunctionInitInput &input) {
	auto &bind_data = input.bind_data->Cast<UnnestBindData>();
	auto result = make_uniq<UnnestGlobalState>();
	auto ref = make_uniq<BoundReferenceExpression>(bind_data.input_type, 0U);
	auto bound_unnest = make_uniq<BoundUnnestExpression>(ListType::GetChildType(bind_data.input_type));
	bound_unnest->child = std::move(ref);
	result->select_list.push_back(std::move(bound_unnest));
	return std::move(result);
}